

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdCelsiusPolygonMode::emulate_mthd(MthdCelsiusPolygonMode *this)

{
  pgraph_state *state;
  uint32_t uVar1;
  byte bVar2;
  uint val;
  long lVar3;
  uint32_t err;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  err = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c >> 6 & 4;
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if (uVar1 == 0x1b00) {
    lVar3 = 1;
  }
  else {
    if (uVar1 != 0x1b02) {
      if (uVar1 == 0x1b01) {
        lVar3 = 2;
        goto LAB_0020b52c;
      }
      err = err | 1;
    }
    lVar3 = 0;
  }
LAB_0020b52c:
  if (err != 0) {
    MthdTest::warn((MthdTest *)this,err);
    return;
  }
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    bVar2 = (char)this->which * '\x02';
    val = (uint)(lVar3 << (bVar2 & 0x3f)) |
          ~(uint)(3L << (bVar2 & 0x3f)) &
          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster = val;
    pgraph_celsius_icmd(state,0x22,val,true);
    return;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		uint32_t rv = 0;
		switch (val) {
			case 0x1b00:
				rv = 1;
				break;
			case 0x1b01:
				rv = 2;
				break;
			case 0x1b02:
				rv = 0;
				break;
			default:
				err |= 1;
		}
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.bundle_raster, which * 2, 2, rv);
				pgraph_celsius_icmd(&exp, 0x22, exp.bundle_raster, true);
			}
		}
	}